

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tag_scalar.hpp
# Opt level: O0

string_t * __thiscall
cfgfile::tag_scalar_t<QString,_cfgfile::qstring_trait_t>::print
          (tag_scalar_t<QString,_cfgfile::qstring_trait_t> *this,int indent)

{
  bool bVar1;
  int iVar2;
  qsizetype qVar3;
  long lVar4;
  undefined4 extraout_var;
  reference pptVar5;
  int in_EDX;
  tag_t<cfgfile::qstring_trait_t> *in_RSI;
  string_t *in_RDI;
  string_t *in_stack_00000048;
  tag_t<cfgfile::qstring_trait_t> *tag;
  const_iterator __end0;
  const_iterator __begin0;
  child_tags_list_t *__range4;
  string_t tmp;
  pos_t i;
  string_t spaces;
  pos_t sections;
  QString value;
  string_t *result;
  QString *in_stack_fffffffffffffe48;
  qstring_wrapper_t *in_stack_fffffffffffffe50;
  QChar ch;
  undefined4 in_stack_fffffffffffffe60;
  size_type in_stack_fffffffffffffe64;
  tag_t<cfgfile::qstring_trait_t> *in_stack_fffffffffffffe68;
  undefined1 local_158 [24];
  tag_t<cfgfile::qstring_trait_t> *local_140;
  tag_t<cfgfile::qstring_trait_t> **local_138;
  __normal_iterator<cfgfile::tag_t<cfgfile::qstring_trait_t>_*const_*,_std::vector<cfgfile::tag_t<cfgfile::qstring_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::qstring_trait_t>_*>_>_>
  local_130;
  qstring_wrapper_t *local_128;
  undefined2 local_11e;
  undefined2 local_11c;
  undefined2 local_11a;
  undefined1 local_118 [78];
  undefined2 local_ca;
  undefined2 local_aa;
  long local_a8;
  undefined2 local_9a;
  long local_80;
  QString local_60;
  undefined2 local_46;
  undefined2 local_44;
  undefined2 local_42;
  undefined1 local_15;
  int local_14;
  qstring_wrapper_t *this_00;
  
  local_15 = 0;
  local_14 = in_EDX;
  qstring_wrapper_t::qstring_wrapper_t((qstring_wrapper_t *)0x110d35);
  bVar1 = tag_t<cfgfile::qstring_trait_t>::is_defined(in_stack_fffffffffffffe68);
  if (bVar1) {
    local_42 = const_t<cfgfile::qstring_trait_t>::c_tab;
    qstring_wrapper_t::qstring_wrapper_t
              ((qstring_wrapper_t *)in_stack_fffffffffffffe48,0,
               (QChar)(char16_t)((ulong)in_stack_fffffffffffffe50 >> 0x30));
    qstring_wrapper_t::append
              (in_stack_fffffffffffffe50,(qstring_wrapper_t *)in_stack_fffffffffffffe48);
    qstring_wrapper_t::~qstring_wrapper_t((qstring_wrapper_t *)0x110da3);
    local_44 = const_t<cfgfile::qstring_trait_t>::c_begin_tag;
    qstring_wrapper_t::push_back
              ((qstring_wrapper_t *)in_stack_fffffffffffffe48,
               (QChar)(char16_t)((ulong)in_stack_fffffffffffffe50 >> 0x30));
    tag_t<cfgfile::qstring_trait_t>::name(in_RSI);
    qstring_wrapper_t::append
              (in_stack_fffffffffffffe50,(qstring_wrapper_t *)in_stack_fffffffffffffe48);
    local_46 = const_t<cfgfile::qstring_trait_t>::c_space;
    qstring_wrapper_t::push_back
              ((qstring_wrapper_t *)in_stack_fffffffffffffe48,
               (QChar)(char16_t)((ulong)in_stack_fffffffffffffe50 >> 0x30));
    format_t<QString,_cfgfile::qstring_trait_t>::to_string(in_stack_fffffffffffffe48);
    qstring_wrapper_t::operator_cast_to_QString((qstring_wrapper_t *)in_stack_fffffffffffffe48);
    qstring_wrapper_t::~qstring_wrapper_t((qstring_wrapper_t *)0x110e42);
    qVar3 = QString::length(&local_60);
    lVar4 = qVar3 / 0x50;
    qVar3 = QString::length(&local_60);
    local_80 = lVar4 + (int)(uint)(0 < qVar3 % 0x50);
    if (local_80 == 0) {
      local_11a = const_t<cfgfile::qstring_trait_t>::c_quotes;
      qstring_wrapper_t::push_back
                ((qstring_wrapper_t *)in_stack_fffffffffffffe48,
                 (QChar)(char16_t)((ulong)in_stack_fffffffffffffe50 >> 0x30));
      local_11c = const_t<cfgfile::qstring_trait_t>::c_quotes;
      ch.ucs = (char16_t)((ulong)in_stack_fffffffffffffe50 >> 0x30);
      qstring_wrapper_t::push_back((qstring_wrapper_t *)in_stack_fffffffffffffe48,ch);
    }
    else {
      tag_t<cfgfile::qstring_trait_t>::name(in_RSI);
      in_stack_fffffffffffffe64 = qstring_wrapper_t::length((qstring_wrapper_t *)0x110eba);
      local_9a = const_t<cfgfile::qstring_trait_t>::c_space;
      qstring_wrapper_t::qstring_wrapper_t
                ((qstring_wrapper_t *)in_stack_fffffffffffffe48,0,
                 (QChar)(char16_t)((ulong)in_stack_fffffffffffffe50 >> 0x30));
      for (local_a8 = 0; local_a8 < local_80; local_a8 = local_a8 + 1) {
        if (0 < local_a8) {
          local_aa = const_t<cfgfile::qstring_trait_t>::c_carriage_return;
          qstring_wrapper_t::push_back
                    ((qstring_wrapper_t *)in_stack_fffffffffffffe48,
                     (QChar)(char16_t)((ulong)in_stack_fffffffffffffe50 >> 0x30));
          local_ca = const_t<cfgfile::qstring_trait_t>::c_tab;
          qstring_wrapper_t::qstring_wrapper_t
                    ((qstring_wrapper_t *)in_stack_fffffffffffffe48,0,
                     (QChar)(char16_t)((ulong)in_stack_fffffffffffffe50 >> 0x30));
          qstring_wrapper_t::append
                    (in_stack_fffffffffffffe50,(qstring_wrapper_t *)in_stack_fffffffffffffe48);
          qstring_wrapper_t::~qstring_wrapper_t((qstring_wrapper_t *)0x110f98);
          qstring_wrapper_t::append
                    (in_stack_fffffffffffffe50,(qstring_wrapper_t *)in_stack_fffffffffffffe48);
        }
        QString::mid((longlong)local_118,(longlong)&local_60);
        qstring_wrapper_t::qstring_wrapper_t(in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
        to_cfgfile_format<cfgfile::qstring_trait_t>(in_stack_00000048);
        qstring_wrapper_t::~qstring_wrapper_t((qstring_wrapper_t *)0x1110af);
        QString::~QString((QString *)0x1110bc);
        qstring_wrapper_t::append
                  (in_stack_fffffffffffffe50,(qstring_wrapper_t *)in_stack_fffffffffffffe48);
        qstring_wrapper_t::~qstring_wrapper_t((qstring_wrapper_t *)0x1110dd);
      }
      qstring_wrapper_t::~qstring_wrapper_t((qstring_wrapper_t *)0x11116c);
      ch.ucs = (char16_t)((ulong)in_stack_fffffffffffffe50 >> 0x30);
    }
    (*in_RSI->_vptr_tag_t[2])();
    bVar1 = std::
            vector<cfgfile::tag_t<cfgfile::qstring_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::qstring_trait_t>_*>_>
            ::empty((vector<cfgfile::tag_t<cfgfile::qstring_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::qstring_trait_t>_*>_>
                     *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60));
    if (!bVar1) {
      local_11e = const_t<cfgfile::qstring_trait_t>::c_carriage_return;
      qstring_wrapper_t::push_back((qstring_wrapper_t *)in_stack_fffffffffffffe48,ch);
      iVar2 = (*in_RSI->_vptr_tag_t[2])();
      this_00 = (qstring_wrapper_t *)CONCAT44(extraout_var,iVar2);
      local_128 = this_00;
      local_130._M_current =
           (tag_t<cfgfile::qstring_trait_t> **)
           std::
           vector<cfgfile::tag_t<cfgfile::qstring_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::qstring_trait_t>_*>_>
           ::begin((vector<cfgfile::tag_t<cfgfile::qstring_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::qstring_trait_t>_*>_>
                    *)in_stack_fffffffffffffe48);
      local_138 = (tag_t<cfgfile::qstring_trait_t> **)
                  std::
                  vector<cfgfile::tag_t<cfgfile::qstring_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::qstring_trait_t>_*>_>
                  ::end((vector<cfgfile::tag_t<cfgfile::qstring_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::qstring_trait_t>_*>_>
                         *)in_stack_fffffffffffffe48);
      while (bVar1 = __gnu_cxx::operator!=
                               ((__normal_iterator<cfgfile::tag_t<cfgfile::qstring_trait_t>_*const_*,_std::vector<cfgfile::tag_t<cfgfile::qstring_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::qstring_trait_t>_*>_>_>
                                 *)this_00,
                                (__normal_iterator<cfgfile::tag_t<cfgfile::qstring_trait_t>_*const_*,_std::vector<cfgfile::tag_t<cfgfile::qstring_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::qstring_trait_t>_*>_>_>
                                 *)in_stack_fffffffffffffe48), bVar1) {
        pptVar5 = __gnu_cxx::
                  __normal_iterator<cfgfile::tag_t<cfgfile::qstring_trait_t>_*const_*,_std::vector<cfgfile::tag_t<cfgfile::qstring_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::qstring_trait_t>_*>_>_>
                  ::operator*(&local_130);
        local_140 = *pptVar5;
        (*local_140->_vptr_tag_t[3])(local_158,local_140,(ulong)(local_14 + 1));
        qstring_wrapper_t::append(this_00,(qstring_wrapper_t *)in_stack_fffffffffffffe48);
        qstring_wrapper_t::~qstring_wrapper_t((qstring_wrapper_t *)0x1112d3);
        __gnu_cxx::
        __normal_iterator<cfgfile::tag_t<cfgfile::qstring_trait_t>_*const_*,_std::vector<cfgfile::tag_t<cfgfile::qstring_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::qstring_trait_t>_*>_>_>
        ::operator++(&local_130);
      }
      qstring_wrapper_t::qstring_wrapper_t
                ((qstring_wrapper_t *)in_stack_fffffffffffffe48,0,
                 (QChar)(char16_t)((ulong)this_00 >> 0x30));
      qstring_wrapper_t::append(this_00,(qstring_wrapper_t *)in_stack_fffffffffffffe48);
      ch.ucs = (char16_t)((ulong)this_00 >> 0x30);
      qstring_wrapper_t::~qstring_wrapper_t((qstring_wrapper_t *)0x111347);
    }
    qstring_wrapper_t::push_back((qstring_wrapper_t *)in_stack_fffffffffffffe48,ch);
    qstring_wrapper_t::push_back((qstring_wrapper_t *)in_stack_fffffffffffffe48,ch);
    QString::~QString((QString *)0x1113b6);
  }
  return in_RDI;
}

Assistant:

typename Trait::string_t print( int indent = 0 ) const override
	{
		typename Trait::string_t result;

		if( this->is_defined() )
		{
			result.append( typename Trait::string_t( indent,
				const_t< Trait >::c_tab ) );

			result.push_back( const_t< Trait >::c_begin_tag );
			result.append( this->name() );
			result.push_back( const_t< Trait >::c_space );

			QString value = format_t< QString, Trait >::to_string( m_value );

			const typename Trait::pos_t sections =
				( value.length() / c_max_string_length +
				( value.length() % c_max_string_length > 0 ? 1 : 0 ) );

			if( sections )
			{
				const typename Trait::string_t spaces = typename Trait::string_t(
					this->name().length() + 2, const_t< Trait >::c_space );

				for( typename Trait::pos_t i = 0; i < sections; ++i )
				{
					if( i > 0 )
					{
						result.push_back( const_t< Trait >::c_carriage_return );

						result.append( typename Trait::string_t( indent,
							const_t< Trait >::c_tab ) );

						result.append( spaces );
					}

					const typename Trait::string_t tmp =
						to_cfgfile_format< Trait >(
							value.mid( i * c_max_string_length,
								c_max_string_length ) );

					result.append( tmp );
				}
			}
			else
			{
				result.push_back( const_t< Trait >::c_quotes );
				result.push_back( const_t< Trait >::c_quotes );
			}

			if( !this->children().empty() )
			{
				result.push_back( const_t< Trait >::c_carriage_return );

				for( const tag_t< Trait > * tag : this->children() )
					result.append( tag->print( indent + 1 ) );

				result.append( typename Trait::string_t( indent,
					const_t< Trait >::c_tab ) );
			}

			result.push_back( const_t< Trait >::c_end_tag );
			result.push_back( const_t< Trait >::c_carriage_return );
		}

		return result;
	}